

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O3

uint16_t __thiscall Handler::Purchase(Handler *this,VirtualMachine *vm)

{
  pointer this_00;
  undefined2 uVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  short sVar4;
  long lVar5;
  pointer pDVar6;
  pointer pPVar7;
  pointer pMVar8;
  pointer pRVar9;
  pointer pSVar10;
  undefined8 in_RAX;
  DeployedVirtualMachine *deployedVM;
  PurchasedServer *__args;
  pointer pDVar11;
  pointer pPVar12;
  pointer pMVar13;
  pointer pRVar14;
  uint uVar15;
  PurchasedServer *item;
  uint16_t *puVar16;
  ulong uVar17;
  pointer pPVar18;
  ushort uVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  uint8_t serverIdx;
  undefined8 uStack_28;
  
  bVar20 = this->N;
  uVar17 = 0xff;
  uStack_28._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  uStack_28._0_3_ = (undefined3)in_RAX;
  uStack_28._0_4_ = CONCAT13(bVar20 - 1,(undefined3)uStack_28);
  if (bVar20 != 0) {
    puVar16 = &((this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
                super__Vector_impl_data._M_start)->memorySize;
    uVar17 = 0;
    do {
      if (vm->nodeType == false) {
        if (vm->cpuCore <= puVar16[-1] >> 1) {
          uVar19 = *puVar16 >> 1;
          goto joined_r0x0010a8cd;
        }
      }
      else if (vm->cpuCore <= puVar16[-1]) {
        uVar19 = *puVar16;
joined_r0x0010a8cd:
        if (vm->memorySize <= uVar19) {
          uStack_28._0_4_ = CONCAT13((char)uVar17,(undefined3)uStack_28);
          goto LAB_0010a8e5;
        }
      }
      uVar17 = uVar17 + 1;
      puVar16 = puVar16 + 0x1c;
    } while (bVar20 != uVar17);
    uVar17 = (ulong)(byte)(bVar20 - 1);
  }
LAB_0010a8e5:
  bVar20 = (byte)uVar17;
  __args = (PurchasedServer *)operator_new(0x48);
  (__args->deployedVM)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__args->deployedVM)._M_h._M_bucket_count = 0;
  __args->id = 0;
  __args->serverIdx = '\0';
  __args->vacancyRate = '\0';
  __args->remainCpuCoreA = 0;
  __args->remainCpuCoreB = 0;
  __args->remainMemorySizeA = 0;
  __args->remainMemorySizeB = 0;
  *(undefined4 *)&__args->field_0xc = 0;
  (__args->deployedVM)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__args->deployedVM)._M_h._M_element_count = 0;
  *(undefined8 *)&(__args->deployedVM)._M_h._M_rehash_policy = 0;
  (__args->deployedVM)._M_h._M_buckets = &(__args->deployedVM)._M_h._M_single_bucket;
  (__args->deployedVM)._M_h._M_bucket_count = 1;
  (__args->deployedVM)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__args->deployedVM)._M_h._M_rehash_policy._M_next_resize = 0;
  (__args->deployedVM)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = (this->result).super__Vector_base<Result,_std::allocator<Result>_>._M_impl.
            super__Vector_impl_data._M_start + this->today;
  uVar19 = this->totalPurchasedServerNum;
  lVar5 = *(long *)&(this_00->extendResult).
                    super__Vector_base<ExtendResult,_std::allocator<ExtendResult>_>._M_impl;
  uVar15 = (uint)((ulong)((long)*(pointer *)
                                 ((long)&(this_00->extendResult).
                                         super__Vector_base<ExtendResult,_std::allocator<ExtendResult>_>
                                         ._M_impl + 8) - lVar5) >> 2);
  if (0 < (int)uVar15) {
    uVar17 = 0;
    do {
      sVar4 = *(short *)(lVar5 + 2 + uVar17 * 4);
      uVar19 = uVar19 + sVar4;
      if (*(byte *)(lVar5 + uVar17 * 4) == bVar20) {
        *(short *)(lVar5 + 2 + uVar17 * 4) = sVar4 + 1;
        if ((int)uVar17 < (int)(uVar15 - 1)) {
          pDVar6 = (this->deployedVMs).
                   super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pDVar11 = (this->deployedVMs).
                         super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>
                         ._M_impl.super__Vector_impl_data._M_start; pDVar11 != pDVar6;
              pDVar11 = pDVar11 + 1) {
            if (uVar19 <= pDVar11->purchasedServerId) {
              pDVar11->purchasedServerId = pDVar11->purchasedServerId + 1;
            }
          }
          pPVar7 = (this->purchasedServers).
                   super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pPVar12 = (this->purchasedServers).
                    super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
                    super__Vector_impl_data._M_start;
          for (pPVar18 = pPVar12; pPVar18 != pPVar7; pPVar18 = pPVar18 + 1) {
            if (uVar19 <= pPVar18->id) {
              pPVar18->id = pPVar18->id + 1;
            }
          }
          uVar15 = ((uint)((int)pPVar7 - (int)pPVar12) >> 3) * 0x38e38e39 & 0xffff;
          if (uVar15 != 0) {
            uVar17 = 0;
            do {
              this->purchasedServerIdxMap[pPVar12->id] = (uint16_t)uVar17;
              uVar17 = uVar17 + 1;
              pPVar12 = pPVar12 + 1;
            } while (uVar15 != uVar17);
          }
          pMVar8 = *(pointer *)
                    ((long)&(this_00->migrateResult).
                            super__Vector_base<MigrateResult,_std::allocator<MigrateResult>_>.
                            _M_impl + 8);
          for (pMVar13 = *(pointer *)
                          &(this_00->migrateResult).
                           super__Vector_base<MigrateResult,_std::allocator<MigrateResult>_>._M_impl
              ; pMVar13 != pMVar8; pMVar13 = pMVar13 + 1) {
            if (uVar19 <= pMVar13->purchasedServerId) {
              pMVar13->purchasedServerId = pMVar13->purchasedServerId + 1;
            }
          }
          pRVar9 = *(pointer *)
                    ((long)&(this_00->requestResult).
                            super__Vector_base<RequestResult,_std::allocator<RequestResult>_>.
                            _M_impl + 8);
          for (pRVar14 = *(pointer *)
                          &(this_00->requestResult).
                           super__Vector_base<RequestResult,_std::allocator<RequestResult>_>._M_impl
              ; pRVar14 != pRVar9; pRVar14 = pRVar14 + 1) {
            if (uVar19 <= pRVar14->purchasedServerId) {
              pRVar14->purchasedServerId = pRVar14->purchasedServerId + 1;
            }
          }
        }
        goto LAB_0010a997;
      }
      uVar17 = uVar17 + 1;
    } while ((uVar15 & 0x7fffffff) != uVar17);
  }
  uStack_28 = CONCAT44(1,(undefined4)uStack_28);
  std::vector<ExtendResult,std::allocator<ExtendResult>>::emplace_back<unsigned_char&,unsigned_int>
            ((vector<ExtendResult,std::allocator<ExtendResult>> *)this_00,
             (uchar *)((long)&uStack_28 + 3),(uint *)((long)&uStack_28 + 4));
  bVar20 = uStack_28._3_1_;
LAB_0010a997:
  __args->id = uVar19;
  __args->serverIdx = bVar20;
  pSVar10 = (this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
            super__Vector_impl_data._M_start + bVar20;
  uVar1 = pSVar10->cpuCore;
  uVar2 = pSVar10->memorySize;
  uVar3 = pSVar10->hardwareCost;
  auVar21._4_4_ = uVar3;
  auVar21._2_2_ = uVar2;
  auVar21._0_2_ = uVar1;
  auVar21._8_8_ = 0;
  auVar21 = pshuflw(auVar21,auVar21,0x50);
  __args->remainCpuCoreA = auVar21._0_2_ >> 1;
  __args->remainCpuCoreB = auVar21._2_2_ >> 1;
  __args->remainMemorySizeA = auVar21._4_2_ >> 1;
  __args->remainMemorySizeB = auVar21._6_2_ >> 1;
  this->purchasedServerIdxMap[uVar19] =
       (short)((uint)(*(int *)&(this->purchasedServers).
                               super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                     *(int *)&(this->purchasedServers).
                              super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x71c7;
  std::vector<PurchasedServer,std::allocator<PurchasedServer>>::emplace_back<PurchasedServer&>
            ((vector<PurchasedServer,std::allocator<PurchasedServer>> *)&this->purchasedServers,
             __args);
  this->totalHardwareCost =
       this->totalHardwareCost +
       (ulong)(this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
              super__Vector_impl_data._M_start[uStack_28 >> 0x18 & 0xff].hardwareCost;
  return this->purchasedServerIdxMap[uVar19];
}

Assistant:

uint16_t Handler::Purchase(const VirtualMachine &vm) {
    uint8_t serverIdx = N - 1u;
    for (uint8_t i = 0u; i < N; ++i) {
        Server &server = servers[i];
        if (CheckCapacity(server, vm)) {
            serverIdx = i;
            break;
        }
    }

    auto *purchasedServer = new PurchasedServer();
    std::vector<ExtendResult> &extendResult = result[today].extendResult;
    uint16_t id = totalPurchasedServerNum;
    int resultIdx = 0, n = (int) extendResult.size();
    bool exist = false;
    for (int i = 0; i < n; ++i) {
        id += extendResult[i].purchaseNum;
        if (extendResult[i].serverIdx == serverIdx) {   // 买过同一型号的 server
            ++extendResult[i].purchaseNum;   // 数量加一表示多买一个
            exist = true;
            resultIdx = i;
            break;
        }
    }

    // 已经购买过这一类型的服务器
    if (exist) {
        if (resultIdx < n - 1) {  // 不是 extendResult 中的最后一个种类
            for (DeployedVirtualMachine &deployedVM : deployedVMs) {
                if (deployedVM.purchasedServerId >= id) ++deployedVM.purchasedServerId;
            }
            for (PurchasedServer &item : purchasedServers) {
                if (item.id >= id) ++item.id;
            }
            ReMapPurchasedServerIdx();

            std::vector<MigrateResult> &migrateResult = result[today].migrateResult;
            for (MigrateResult &res : migrateResult) {
                if (res.purchasedServerId >= id) ++res.purchasedServerId;
            }
            std::vector<RequestResult> &requestResult = result[today].requestResult;
            for (RequestResult &res : requestResult) {
                if (res.purchasedServerId >= id) ++res.purchasedServerId;
            }
        }
    } else {
        extendResult.emplace_back(serverIdx, 1u);
    }

    purchasedServer->id = id;
    purchasedServer->serverIdx = serverIdx;
    purchasedServer->remainCpuCoreA = (servers[serverIdx].cpuCore >> 1u);
    purchasedServer->remainCpuCoreB = (servers[serverIdx].cpuCore >> 1u);
    purchasedServer->remainMemorySizeA = (servers[serverIdx].memorySize >> 1u);
    purchasedServer->remainMemorySizeB = (servers[serverIdx].memorySize >> 1u);
    purchasedServerIdxMap[id] = purchasedServers.size();
    purchasedServers.emplace_back(*purchasedServer);

#ifdef TEST
    totalHardwareCost += servers[serverIdx].hardwareCost;
#endif

    return purchasedServerIdxMap[id];
}